

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * compatibilityAgree_abi_cxx11_
                   (string *__return_storage_ptr__,CompatibleType t,bool dominant)

{
  char *pcVar1;
  allocator local_25 [15];
  allocator local_16;
  undefined1 local_15;
  CompatibleType local_14;
  bool dominant_local;
  string *psStack_10;
  CompatibleType t_local;
  
  local_15 = dominant;
  local_14 = t;
  psStack_10 = __return_storage_ptr__;
  if (t < NumberMinType) {
    pcVar1 = "(Agree)\n";
    if (dominant) {
      pcVar1 = "(Disagree)\n";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_16);
    std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else {
    if (1 < t - NumberMinType) {
      __assert_fail("0 && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                    ,0x1300,"std::string compatibilityAgree(CompatibleType, bool)");
    }
    pcVar1 = "(Ignored)\n";
    if (dominant) {
      pcVar1 = "(Dominant)\n";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityAgree(CompatibleType t, bool dominant)
{
  switch(t)
    {
    case BoolType:
    case StringType:
      return dominant ? "(Disagree)\n" : "(Agree)\n";
    case NumberMaxType:
    case NumberMinType:
      return dominant ? "(Dominant)\n" : "(Ignored)\n";
    }
  assert(0 && "Unreachable!");
  return "";
}